

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTimeCodeAttribute.cpp
# Opt level: O2

void __thiscall
Imf_3_4::TypedAttribute<Imf_3_4::TimeCode>::readValueFrom
          (TypedAttribute<Imf_3_4::TimeCode> *this,IStream *is,int size,int version)

{
  undefined8 in_RAX;
  uchar b [4];
  uchar b_1 [4];
  
  _b = in_RAX;
  (*is->_vptr_IStream[3])(is,b,4);
  TimeCode::setTimeAndFlags(&this->_value,(uint)b,TV60_PACKING);
  (*is->_vptr_IStream[3])(is,b_1,4);
  TimeCode::setUserData(&this->_value,(uint)b_1);
  return;
}

Assistant:

IMF_EXPORT void
TimeCodeAttribute::readValueFrom (
    OPENEXR_IMF_INTERNAL_NAMESPACE::IStream& is, int size, int version)
{
    unsigned int tmp;

    Xdr::read<StreamIO> (is, tmp);
    _value.setTimeAndFlags (tmp);

    Xdr::read<StreamIO> (is, tmp);
    _value.setUserData (tmp);
}